

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_predicate_headers_send(nghttp2_session *session,nghttp2_stream *stream)

{
  int iVar1;
  int rv;
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  session_local._4_4_ = session_predicate_for_stream_send(session,stream);
  if (session_local._4_4_ == 0) {
    if (stream == (nghttp2_stream *)0x0) {
      __assert_fail("stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x7a0,"int session_predicate_headers_send(nghttp2_session *, nghttp2_stream *)"
                   );
    }
    if (stream->state == NGHTTP2_STREAM_OPENED) {
      session_local._4_4_ = 0;
    }
    else if (stream->state == NGHTTP2_STREAM_CLOSING) {
      session_local._4_4_ = -0x1ff;
    }
    else {
      iVar1 = nghttp2_session_is_my_stream_id(session,stream->stream_id);
      if (iVar1 == 0) {
        session_local._4_4_ = -0x202;
      }
      else {
        session_local._4_4_ = 0;
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

static int session_predicate_headers_send(nghttp2_session *session,
                                          nghttp2_stream *stream) {
  int rv;
  rv = session_predicate_for_stream_send(session, stream);
  if (rv != 0) {
    return rv;
  }
  assert(stream);

  switch (stream->state) {
  case NGHTTP2_STREAM_OPENED:
    return 0;
  case NGHTTP2_STREAM_CLOSING:
    return NGHTTP2_ERR_STREAM_CLOSING;
  default:
    if (nghttp2_session_is_my_stream_id(session, stream->stream_id)) {
      return 0;
    }
    return NGHTTP2_ERR_INVALID_STREAM_STATE;
  }
}